

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curious.c
# Opt level: O1

void curious_finalize(curious_t curious_inst)

{
  active_insts = active_insts + -1;
  if (active_insts == 0) {
    curious_finalize_callback_registry();
    curious_disable_wrappers();
    curious_finalize_file_registry();
    return;
  }
  curious_deregister_callbacks(curious_inst);
  return;
}

Assistant:

void curious_finalize(curious_t curious_inst)
{
    //Turn everything off if we don't have any active instances...
    if (0 == --active_insts) {
        curious_finalize_callback_registry();
        curious_disable_wrappers();
        curious_finalize_file_registry();

        // ...and just remove the callbacks from this instance of CURIOUS otherwise
    } else {
        curious_deregister_callbacks(curious_inst);
    }
}